

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

wchar_t effect_calculate_value(effect_handler_context_t_conflict *context,_Bool use_boost)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int sides;
  
  if (set_value != L'\0') {
    return set_value;
  }
  iVar1 = (context->value).base;
  iVar2 = (context->value).dice;
  if (iVar1 < 1) {
    wVar3 = L'\0';
    if ((iVar2 < 1) || (sides = (context->value).sides, sides < 1)) goto LAB_0013cfaf;
  }
  else {
    sides = (context->value).sides;
  }
  iVar2 = damroll(iVar2,sides);
  wVar3 = iVar2 + iVar1;
LAB_0013cfaf:
  if (use_boost) {
    wVar3 = ((context->boost + 100) * wVar3) / 100;
  }
  return wVar3;
}

Assistant:

int effect_calculate_value(effect_handler_context_t *context, bool use_boost)
{
	int final = 0;

	if (set_value) {
		return set_value;
	}

	if (context->value.base > 0 ||
		(context->value.dice > 0 && context->value.sides > 0)) {
		final = context->value.base +
			damroll(context->value.dice, context->value.sides);
	}

	/* Device boost */
	if (use_boost) {
		final *= (100 + context->boost);
		final /= 100;
	}

	return final;
}